

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool __thiscall Js::JavascriptArray::BigIndex::operator>=(BigIndex *this,BigIndex *rhs)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  BigIndex *rhs_local;
  BigIndex *this_local;
  
  bVar1 = IsSmallIndex(rhs);
  if ((bVar1) && (bVar1 = IsSmallIndex(this), bVar1)) {
    uVar3 = GetSmallIndex(this);
    uVar2 = GetSmallIndex(rhs);
    this_local._7_1_ = uVar2 <= uVar3;
  }
  else {
    bVar1 = IsSmallIndex(rhs);
    if ((!bVar1) || (bVar1 = IsSmallIndex(this), bVar1)) {
      bVar1 = IsSmallIndex(rhs);
      if ((bVar1) || (bVar1 = IsSmallIndex(this), !bVar1)) {
        uVar4 = GetBigIndex(this);
        uVar5 = GetBigIndex(rhs);
        this_local._7_1_ = uVar5 <= uVar4;
      }
      else {
        uVar3 = GetSmallIndex(this);
        uVar4 = GetBigIndex(rhs);
        this_local._7_1_ = uVar4 <= uVar3;
      }
    }
    else {
      uVar4 = GetBigIndex(this);
      uVar3 = GetSmallIndex(rhs);
      this_local._7_1_ = uVar3 <= uVar4;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool JavascriptArray::BigIndex::operator>=(const BigIndex& rhs) const
    {
        if (rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            return this->GetSmallIndex() >= rhs.GetSmallIndex();
        }
        else if (rhs.IsSmallIndex() && !this->IsSmallIndex())
        {
            // if lhs is big promote rhs
            return this->GetBigIndex() >= (uint64)rhs.GetSmallIndex();
        }
        else if (!rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            // if rhs is big promote lhs
            return ((uint64)this->GetSmallIndex()) >= rhs.GetBigIndex();
        }
        return this->GetBigIndex() >= rhs.GetBigIndex();
    }